

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O2

int resolve(asctx *ctx,ull *val,match m,ull pos)

{
  int iVar1;
  rbitfield *bf;
  ull uVar2;
  ull uVar3;
  byte bVar4;
  uint uVar5;
  easm_expr **ppeVar6;
  ulong uVar7;
  long lVar8;
  
  lVar8 = -1;
  ppeVar6 = &m.relocs[0].expr;
  do {
    lVar8 = lVar8 + 1;
    if (m.nrelocs <= lVar8) {
      for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
        val[lVar8] = m.a[lVar8];
      }
      return 1;
    }
    uVar2 = calc(*ppeVar6,ctx);
    bf = ((reloc *)(ppeVar6 + -1))->bf;
    uVar7 = uVar2 - bf->addend;
    if (bf->pcrel == 0) {
      bVar4 = (byte)bf->shr;
    }
    else {
      bVar4 = (byte)bf->shr;
      uVar7 = uVar7 - ((bf->pospreadd + pos >> (bVar4 & 0x3f)) << (bVar4 & 0x3f));
    }
    uVar7 = uVar7 >> (bVar4 & 0x3f);
    ppeVar6 = ppeVar6 + 2;
    setsbf(&m,bf->sbf[0].pos,bf->sbf[0].len,uVar7);
    setsbf(&m,bf->sbf[1].pos,bf->sbf[1].len,uVar7 >> ((byte)bf->sbf[0].len & 0x3f));
    ctx->pos = (uint32_t)pos;
    uVar5 = bf->sbf[0].len + bf->shr + bf->sbf[1].len;
    uVar7 = ~(-1L << ((byte)uVar5 & 0x3f));
    if (0x3f < uVar5) {
      uVar7 = 0xffffffffffffffff;
    }
    iVar1 = bf->wrapok;
    uVar3 = getrbf_as(bf,m.a,m.m,pos & 0xffffffff);
  } while (((-(ulong)(iVar1 == 0) | uVar7) & (uVar3 ^ uVar2)) == 0);
  return 0;
}

Assistant:

int resolve (struct asctx *ctx, ull *val, struct match m, ull pos) {
	int i;
	for (i = 0; i < m.nrelocs; i++) {
		ull val = calc(m.relocs[i].expr, ctx);
		const struct rbitfield *bf = m.relocs[i].bf;
		ull num = val - bf->addend;
		if (bf->pcrel)
			num -= (pos + bf->pospreadd) & -(1ull << bf->shr);
		num >>= bf->shr;
		setsbf(&m, bf->sbf[0].pos, bf->sbf[0].len, num);
		num >>= bf->sbf[0].len;
		setsbf(&m, bf->sbf[1].pos, bf->sbf[1].len, num);
		ctx->pos = pos;
		ull mask = ~0ull;
		ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
		if (bf->wrapok && totalsz < 64)
			mask = (1ull << totalsz) - 1;
		if ((getrbf_as(bf, m.a, m.m, ctx->pos) & mask) != (val & mask))
			return 0;
	}
	for (i = 0; i < MAXOPLEN; i++)
		val[i] = m.a[i];
	return 1;
}